

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O0

void lyb_finish_node(lyd_lyb_ctx *lybctx,lyd_node *parent,uint32_t flags,lyd_meta **meta,
                    lyd_node **node,lyd_node **first_p,ly_set *parsed)

{
  lyd_meta *local_40;
  lyd_meta *m;
  lyd_node **first_p_local;
  lyd_node **node_local;
  lyd_meta **meta_local;
  uint32_t flags_local;
  lyd_node *parent_local;
  lyd_lyb_ctx *lybctx_local;
  
  (*node)->flags = flags;
  for (local_40 = *meta; local_40 != (lyd_meta *)0x0; local_40 = local_40->next) {
    local_40->parent = *node;
  }
  (*node)->meta = *meta;
  *meta = (lyd_meta *)0x0;
  lyb_insert_node(lybctx,parent,*node,first_p,parsed);
  if (((lybctx->field_1).field_0.parse_opts & 0x10000) == 0) {
    lyd_validate_node_ext(*node,&lybctx->ext_node);
  }
  *node = (lyd_node *)0x0;
  return;
}

Assistant:

static void
lyb_finish_node(struct lyd_lyb_ctx *lybctx, struct lyd_node *parent, uint32_t flags, struct lyd_meta **meta,
        struct lyd_node **node, struct lyd_node **first_p, struct ly_set *parsed)
{
    struct lyd_meta *m;

    /* set flags */
    (*node)->flags = flags;

    /* add metadata */
    LY_LIST_FOR(*meta, m) {
        m->parent = *node;
    }
    (*node)->meta = *meta;
    *meta = NULL;

    /* insert into parent */
    lyb_insert_node(lybctx, parent, *node, first_p, parsed);

    if (!(lybctx->parse_opts & LYD_PARSE_ONLY)) {
        /* store for ext instance node validation, if needed */
        (void)lyd_validate_node_ext(*node, &lybctx->ext_node);
    }

    *node = NULL;
}